

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void Excel::Parser::parseSST(Record *record,IStorage *storage)

{
  RecordSubstream *this;
  long lVar1;
  BiffVersion in_R9D;
  long lVar2;
  int32_t uniqueStrings;
  int32_t totalStrings;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  sst;
  wstring local_50;
  
  totalStrings = 0;
  uniqueStrings = 0;
  this = &record->m_stream;
  Stream::read<int>(&this->super_Stream,&totalStrings,4);
  Stream::read<int>(&this->super_Stream,&uniqueStrings,4);
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::vector(&sst,(long)uniqueStrings,(allocator_type *)&local_50);
  for (lVar2 = 0; lVar1 = (long)uniqueStrings, lVar2 < lVar1; lVar2 = lVar2 + 1) {
    loadString_abi_cxx11_
              (&local_50,(Excel *)this,(Stream *)&record->m_borders,
               (vector<int,_std::allocator<int>_> *)0x2,0x600,in_R9D);
    (*storage->_vptr_IStorage[2])(storage,lVar1,lVar2,&local_50);
    std::__cxx11::wstring::~wstring((wstring *)&local_50);
  }
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~vector(&sst);
  return;
}

Assistant:

inline void
Parser::parseSST( Record & record, IStorage & storage )
{
	int32_t totalStrings = 0;
	int32_t uniqueStrings = 0;

	record.dataStream().read( totalStrings, 4 );
	record.dataStream().read( uniqueStrings, 4 );

	std::vector< std::wstring > sst( uniqueStrings );

	for( int32_t i = 0; i < uniqueStrings; ++i )
		storage.onSharedString( uniqueStrings, i,
			loadString( record.dataStream(), record.borders() ) );
}